

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PSymbol * __thiscall
PSymbolTable::FindSymbolInTable(PSymbolTable *this,FName *symname,PSymbolTable **symtable)

{
  Node *pNVar1;
  PSymbol *pPVar2;
  Node *pNVar3;
  FName local_4;
  
  pNVar1 = (this->Symbols).Nodes + ((this->Symbols).Size - 1 & symname->Index);
  while ((pNVar3 = pNVar1, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar1 = pNVar3->Next;
    if ((pNVar3->Pair).Key.Index == symname->Index) {
LAB_004a13b8:
      if (pNVar3 == (Node *)0x0) {
        if (this->ParentSymbolTable == (PSymbolTable *)0x0) {
          *symtable = (PSymbolTable *)0x0;
          pPVar2 = (PSymbol *)0x0;
        }
        else {
          pPVar2 = FindSymbolInTable(this->ParentSymbolTable,&local_4,symtable);
        }
      }
      else {
        *symtable = this;
        pPVar2 = (pNVar3->Pair).Value;
      }
      return pPVar2;
    }
  }
  pNVar3 = (Node *)0x0;
  goto LAB_004a13b8;
}

Assistant:

PSymbol *PSymbolTable::FindSymbolInTable(FName symname, PSymbolTable *&symtable)
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL)
	{
		if (ParentSymbolTable != NULL)
		{
			return ParentSymbolTable->FindSymbolInTable(symname, symtable);
		}
		symtable = NULL;
		return NULL;
	}
	symtable = this;
	return *value;
}